

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Segment::ParseNext
          (Segment *this,Cluster *pCurr,Cluster **pResult,longlong *pos,long *len)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  longlong lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  Cluster *pCVar8;
  bool bVar9;
  longlong avail;
  longlong total;
  long local_40;
  undefined1 local_38 [8];
  
  *pResult = (Cluster *)0x0;
  lVar2 = pCurr->m_index;
  if (-1 < lVar2) {
    if (lVar2 + 1 < this->m_clusterCount) {
      *pResult = this->m_clusters[lVar2 + 1];
    }
    else {
      do {
        lVar2 = DoLoadCluster(this,pos,len);
      } while (1 < lVar2);
      if (lVar2 < 0) {
        return lVar2;
      }
      if (lVar2 != 0) {
        return 1;
      }
      if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
        pCVar8 = &this->m_eos;
      }
      else {
        pCVar8 = this->m_clusters[this->m_clusterCount + -1];
      }
      *pResult = pCVar8;
    }
    return 0;
  }
  iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,local_38,&local_40);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  lVar2 = -1;
  if (-1 < this->m_size) {
    lVar2 = this->m_start + this->m_size;
  }
  lVar7 = pCurr->m_element_start;
  *pos = lVar7;
  if (-1 < pCurr->m_element_size) {
    *pos = pCurr->m_element_size + lVar7;
    goto LAB_00158cd7;
  }
  if (local_40 <= lVar7) {
    *len = 1;
    return -3;
  }
  uVar3 = GetUIntLength(this->m_pReader,lVar7,len);
  bVar9 = uVar3 != 0;
  if (((long)uVar3 < 0) || (uVar3 = 0xfffffffffffffffd, bVar9)) {
LAB_00158da1:
    bVar9 = false;
    uVar5 = uVar3;
  }
  else {
    if ((-1 < lVar2) && (lVar2 < *len + *pos)) {
LAB_00158d79:
      uVar3 = 0xfffffffffffffffe;
      goto LAB_00158da1;
    }
    if (local_40 < *len + *pos) goto LAB_00158da1;
    lVar4 = ReadUInt(this->m_pReader,*pos,len);
    if (lVar4 != 0x1f43b675) {
      uVar3 = 0xffffffffffffffff;
      goto LAB_00158da1;
    }
    lVar7 = *pos + *len;
    *pos = lVar7;
    if (local_40 <= lVar7) {
      *len = 1;
      goto LAB_00158da1;
    }
    uVar5 = GetUIntLength(this->m_pReader,lVar7,len);
    if (-1 < (long)uVar5) {
      if (uVar5 == 0) {
        if ((-1 < lVar2) && (lVar2 < *len + *pos)) goto LAB_00158d79;
        if (*len + *pos <= local_40) {
          uVar5 = ReadUInt(this->m_pReader,*pos,len);
          if ((long)uVar5 < 0) goto LAB_00158eb4;
          lVar7 = *len;
          lVar6 = *pos + lVar7;
          *pos = lVar6;
          uVar3 = 0xfffffffffffffffe;
          if (((-1L << ((char)lVar7 * '\a' & 0x3fU) ^ uVar5) != 0xffffffffffffffff) &&
             ((lVar6 = lVar6 + uVar5, lVar2 < 0 || (lVar6 <= lVar2)))) {
            *pos = lVar6;
            bVar9 = true;
            uVar5 = uVar3;
            goto LAB_00158da3;
          }
        }
      }
      goto LAB_00158da1;
    }
LAB_00158eb4:
    bVar9 = false;
  }
LAB_00158da3:
  if (!bVar9) {
    return uVar5;
  }
LAB_00158cd7:
  do {
    lVar2 = DoParseNext(this,pResult,pos,len);
  } while (1 < lVar2);
  return lVar2;
}

Assistant:

long Segment::ParseNext(const Cluster* pCurr, const Cluster*& pResult,
                        long long& pos, long& len) {
  assert(pCurr);
  assert(!pCurr->EOS());
  assert(m_clusters);

  pResult = 0;

  if (pCurr->m_index >= 0) {  // loaded (not merely preloaded)
    assert(m_clusters[pCurr->m_index] == pCurr);

    const long next_idx = pCurr->m_index + 1;

    if (next_idx < m_clusterCount) {
      pResult = m_clusters[next_idx];
      return 0;  // success
    }

    // curr cluster is last among loaded

    const long result = LoadCluster(pos, len);

    if (result < 0)  // error or underflow
      return result;

    if (result > 0)  // no more clusters
    {
      // pResult = &m_eos;
      return 1;
    }

    pResult = GetLast();
    return 0;  // success
  }

  assert(m_pos > 0);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // interrogate curr cluster

  pos = pCurr->m_element_start;

  if (pCurr->m_element_size >= 0)
    pos += pCurr->m_element_size;
  else {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadUInt(m_pReader, pos, len);

    if (id != libwebm::kMkvCluster)
      return -1;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)  // TODO: should never happen
      return E_FILE_FORMAT_INVALID;  // TODO: resolve this

    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // Pos now points to start of payload

    pos += size;  // consume payload (that is, the current cluster)
    if (segment_stop >= 0 && pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    // By consuming the payload, we are assuming that the curr
    // cluster isn't interesting.  That is, we don't bother checking
    // whether the payload of the curr cluster is less than what
    // happens to be available (obtained via IMkvReader::Length).
    // Presumably the caller has already dispensed with the current
    // cluster, and really does want the next cluster.
  }

  // pos now points to just beyond the last fully-loaded cluster

  for (;;) {
    const long status = DoParseNext(pResult, pos, len);

    if (status <= 1)
      return status;
  }
}